

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O3

void cfd::api::json::PsbtMapData::CollectFieldName(void)

{
  CLASS_FUNCTION_TABLE<cfd::api::json::PsbtMapData> func_table;
  _Any_data local_f8;
  undefined1 local_e8 [16];
  code *local_d8 [2];
  code *local_c8;
  code *local_c0;
  code *local_b8 [2];
  code *local_a8;
  code *local_a0;
  _Any_data local_98;
  code *local_88;
  undefined8 uStack_80;
  _Any_data local_78;
  code *local_68;
  undefined8 uStack_60;
  _Any_data local_58;
  code *local_48;
  undefined8 uStack_40;
  
  if (json_mapper_abi_cxx11_._40_8_ == 0) {
    local_48 = (code *)0x0;
    uStack_40 = 0;
    local_58._M_unused._M_object = (void *)0x0;
    local_58._8_8_ = 0;
    local_68 = (code *)0x0;
    uStack_60 = 0;
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    local_88 = (code *)0x0;
    uStack_80 = 0;
    local_98._M_unused._M_object = (void *)0x0;
    local_98._8_8_ = 0;
    local_f8._8_8_ = 0;
    local_f8._M_unused._M_object = GetKeyString_abi_cxx11_;
    local_e8._8_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::PsbtMapData_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::PsbtMapData_&)>
         ::_M_invoke;
    local_e8._0_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::PsbtMapData_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::PsbtMapData_&)>
         ::_M_manager;
    local_d8[1] = (code *)0x0;
    local_d8[0] = SetKeyString;
    local_c0 = std::
               _Function_handler<void_(cfd::api::json::PsbtMapData_&,_const_UniValue_&),_void_(*)(cfd::api::json::PsbtMapData_&,_const_UniValue_&)>
               ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::PsbtMapData_&,_const_UniValue_&),_void_(*)(cfd::api::json::PsbtMapData_&,_const_UniValue_&)>
               ::_M_manager;
    local_b8[1] = (code *)0x0;
    local_b8[0] = GetKeyFieldType_abi_cxx11_;
    local_a0 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::PsbtMapData_&)>
    ::operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::PsbtMapData_&)>
                 *)&local_98,
                (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::PsbtMapData_&)>
                 *)&local_f8);
    std::function<void_(cfd::api::json::PsbtMapData_&,_const_UniValue_&)>::operator=
              ((function<void_(cfd::api::json::PsbtMapData_&,_const_UniValue_&)> *)&local_78,
               (function<void_(cfd::api::json::PsbtMapData_&,_const_UniValue_&)> *)local_d8);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)&local_58,
              (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)local_b8);
    if (local_a8 != (code *)0x0) {
      (*local_a8)((_Any_data *)local_b8,(_Any_data *)local_b8,__destroy_functor);
    }
    if (local_c8 != (code *)0x0) {
      (*local_c8)((_Any_data *)local_d8,(_Any_data *)local_d8,__destroy_functor);
    }
    if ((code *)local_e8._0_8_ != (code *)0x0) {
      (*(code *)local_e8._0_8_)(&local_f8,&local_f8,3);
    }
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtMapData>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtMapData>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtMapData>>>>
    ::
    _M_emplace_unique<char_const(&)[4],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtMapData>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtMapData>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtMapData>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtMapData>>>>
                *)json_mapper_abi_cxx11_,(char (*) [4])0x5da0cc,
               (CLASS_FUNCTION_TABLE<cfd::api::json::PsbtMapData> *)&local_98);
    local_f8._M_unused._M_object = local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"key","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8);
    if ((undefined1 *)local_f8._M_unused._0_8_ != local_e8) {
      operator_delete(local_f8._M_unused._M_object);
    }
    local_f8._8_8_ = 0;
    local_f8._M_unused._M_object = GetValueString_abi_cxx11_;
    local_e8._8_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::PsbtMapData_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::PsbtMapData_&)>
         ::_M_invoke;
    local_e8._0_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::PsbtMapData_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::PsbtMapData_&)>
         ::_M_manager;
    local_d8[1] = (code *)0x0;
    local_d8[0] = SetValueString;
    local_c0 = std::
               _Function_handler<void_(cfd::api::json::PsbtMapData_&,_const_UniValue_&),_void_(*)(cfd::api::json::PsbtMapData_&,_const_UniValue_&)>
               ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::PsbtMapData_&,_const_UniValue_&),_void_(*)(cfd::api::json::PsbtMapData_&,_const_UniValue_&)>
               ::_M_manager;
    local_b8[1] = (code *)0x0;
    local_b8[0] = GetValueFieldType_abi_cxx11_;
    local_a0 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::PsbtMapData_&)>
    ::operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::PsbtMapData_&)>
                 *)&local_98,
                (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::PsbtMapData_&)>
                 *)&local_f8);
    std::function<void_(cfd::api::json::PsbtMapData_&,_const_UniValue_&)>::operator=
              ((function<void_(cfd::api::json::PsbtMapData_&,_const_UniValue_&)> *)&local_78,
               (function<void_(cfd::api::json::PsbtMapData_&,_const_UniValue_&)> *)local_d8);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)&local_58,
              (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)local_b8);
    if (local_a8 != (code *)0x0) {
      (*local_a8)((_Any_data *)local_b8,(_Any_data *)local_b8,__destroy_functor);
    }
    if (local_c8 != (code *)0x0) {
      (*local_c8)((_Any_data *)local_d8,(_Any_data *)local_d8,__destroy_functor);
    }
    if ((code *)local_e8._0_8_ != (code *)0x0) {
      (*(code *)local_e8._0_8_)(&local_f8,&local_f8,3);
    }
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtMapData>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtMapData>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtMapData>>>>
    ::
    _M_emplace_unique<char_const(&)[6],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtMapData>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtMapData>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtMapData>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtMapData>>>>
                *)json_mapper_abi_cxx11_,(char (*) [6])0x5dca53,
               (CLASS_FUNCTION_TABLE<cfd::api::json::PsbtMapData> *)&local_98);
    local_f8._M_unused._M_object = local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"value","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8);
    if ((undefined1 *)local_f8._M_unused._0_8_ != local_e8) {
      operator_delete(local_f8._M_unused._M_object);
    }
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
    if (local_68 != (code *)0x0) {
      (*local_68)(&local_78,&local_78,__destroy_functor);
    }
    if (local_88 != (code *)0x0) {
      (*local_88)(&local_98,&local_98,__destroy_functor);
    }
  }
  return;
}

Assistant:

XpubDataStruct XpubData::ConvertToStruct() const {  // NOLINT
  XpubDataStruct result;
  result.base58 = base58_;
  result.hex = hex_;
  result.ignore_items = ignore_items;
  return result;
}